

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTDMT_jobDescription * ZSTDMT_createJobsTable(U32 *nbJobsPtr,ZSTD_customMem cMem)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  ZSTDMT_jobDescription *jobTable;
  uint nbJobs;
  ulong uVar4;
  uint uVar5;
  pthread_cond_t *__cond;
  bool bVar6;
  
  UVar1 = ZSTD_highbit32(*nbJobsPtr);
  nbJobs = 2 << ((byte)UVar1 & 0x1f);
  jobTable = (ZSTDMT_jobDescription *)ZSTD_calloc(0x178L << ((byte)UVar1 + 1 & 0x3f),cMem);
  uVar5 = 0;
  if (jobTable != (ZSTDMT_jobDescription *)0x0) {
    *nbJobsPtr = nbJobs;
    uVar4 = (ulong)nbJobs;
    __cond = (pthread_cond_t *)&jobTable->job_cond;
    while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
      uVar2 = pthread_mutex_init((pthread_mutex_t *)((long)__cond + -0x28),
                                 (pthread_mutexattr_t *)0x0);
      uVar3 = pthread_cond_init(__cond,(pthread_condattr_t *)0x0);
      uVar5 = uVar5 | uVar3 | uVar2;
      __cond = (pthread_cond_t *)((long)__cond + 0x178);
    }
    if (uVar5 == 0) {
      return jobTable;
    }
    ZSTDMT_freeJobsTable(jobTable,nbJobs,cMem);
  }
  return (ZSTDMT_jobDescription *)0x0;
}

Assistant:

static ZSTDMT_jobDescription* ZSTDMT_createJobsTable(U32* nbJobsPtr, ZSTD_customMem cMem)
{
    U32 const nbJobsLog2 = ZSTD_highbit32(*nbJobsPtr) + 1;
    U32 const nbJobs = 1 << nbJobsLog2;
    U32 jobNb;
    ZSTDMT_jobDescription* const jobTable = (ZSTDMT_jobDescription*)
                ZSTD_calloc(nbJobs * sizeof(ZSTDMT_jobDescription), cMem);
    int initError = 0;
    if (jobTable==NULL) return NULL;
    *nbJobsPtr = nbJobs;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        initError |= ZSTD_pthread_mutex_init(&jobTable[jobNb].job_mutex, NULL);
        initError |= ZSTD_pthread_cond_init(&jobTable[jobNb].job_cond, NULL);
    }
    if (initError != 0) {
        ZSTDMT_freeJobsTable(jobTable, nbJobs, cMem);
        return NULL;
    }
    return jobTable;
}